

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O2

void Throw(string *failureMessage,char *originator,char *sourceLocation)

{
  logic_error *this;
  string sStack_38;
  
  if (originator != (char *)0x0) {
    Fmt_abi_cxx11_(&sStack_38,"\n    Origin: %s",originator);
    std::__cxx11::string::append((string *)failureMessage);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  if (sourceLocation != (char *)0x0) {
    Fmt_abi_cxx11_(&sStack_38,"\n    Source: %s",sourceLocation);
    std::__cxx11::string::append((string *)failureMessage);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  this = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this,(string *)failureMessage);
  __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

[[noreturn]] inline void Throw(std::string failureMessage, const char* originator = nullptr, const char* sourceLocation = nullptr) {
    if (originator != nullptr) {
        failureMessage += Fmt("\n    Origin: %s", originator);
    }
    if (sourceLocation != nullptr) {
        failureMessage += Fmt("\n    Source: %s", sourceLocation);
    }

    throw std::logic_error(failureMessage);
}